

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

void __thiscall re2::DFA::AddToQueue(DFA *this,Workq *q,int id,uint flag)

{
  int *piVar1;
  Prog *pPVar2;
  Inst *pIVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint i;
  LogMessage local_1b0;
  
  piVar1 = this->astack_;
  *piVar1 = id;
  uVar7 = 1;
  do {
    if (this->nastack_ < (int)uVar7) {
      __assert_fail("(nstk) <= (nastack_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                    0x32e,"void re2::DFA::AddToQueue(Workq *, int, uint)");
    }
    uVar7 = (ulong)((int)uVar7 - 1);
    i = piVar1[uVar7];
    while (i != 0) {
      if (i == 0xffffffff) {
        if (q->last_was_mark_ == false) {
          q->last_was_mark_ = false;
          iVar6 = q->nextmark_;
          q->nextmark_ = iVar6 + 1;
          SparseSet::insert_new(&q->super_SparseSet,iVar6);
        }
        break;
      }
      bVar4 = SparseSet::contains(&q->super_SparseSet,i);
      if (bVar4) break;
      q->last_was_mark_ = false;
      SparseSet::insert_new(&q->super_SparseSet,i);
      pPVar2 = this->prog_;
      pIVar3 = pPVar2->inst_;
      uVar5 = pIVar3[(int)i].out_opcode_;
      iVar6 = (int)uVar7;
      switch(uVar5 & 7) {
      case 1:
        if ((uVar5 & 8) != 0) {
          __assert_fail("!ip->last()",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc"
                        ,0x361,"void re2::DFA::AddToQueue(Workq *, int, uint)");
        }
        i = i + 1;
        goto LAB_00127594;
      case 2:
      case 5:
        i = i + ((uVar5 & 8) >> 3 ^ 1);
        uVar5 = (uVar5 & 8) >> 1 ^ 4;
        break;
      case 3:
      case 6:
        if ((uVar5 & 8) == 0) {
          uVar7 = (ulong)(iVar6 + 1);
          piVar1[iVar6] = i + 1;
        }
        if (((((pIVar3[(int)i].out_opcode_ & 7) == 6) && (0 < q->maxmark_)) &&
            (i == pPVar2->start_unanchored_)) && (i != pPVar2->start_)) {
          iVar6 = (int)uVar7;
          uVar7 = (ulong)(iVar6 + 1);
          piVar1[iVar6] = -1;
        }
        i = pIVar3[(int)i].out_opcode_ >> 4;
LAB_00127594:
        uVar5 = 4;
        break;
      case 4:
        if ((uVar5 & 8) == 0) {
          uVar7 = (ulong)(iVar6 + 1);
          piVar1[iVar6] = i + 1;
        }
        if ((pIVar3[(int)i].out_opcode_ & 7) != 4) {
          __assert_fail("(opcode()) == (kInstEmptyWidth)",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                        ,0x73,"EmptyOp re2::Prog::Inst::empty()");
        }
        bVar4 = (pIVar3[(int)i].field_1.out1_ & ~flag) == 0;
        if (bVar4) {
          i = pIVar3[(int)i].out_opcode_ >> 4;
        }
        uVar5 = (uint)bVar4 << 2;
        break;
      default:
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                   0x347,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"unhandled opcode: ",0x12);
        std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar3[(int)i].out_opcode_ & 7);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        uVar5 = 0;
      }
      if (uVar5 == 0) break;
    }
    if ((int)uVar7 < 1) {
      return;
    }
  } while( true );
}

Assistant:

void DFA::AddToQueue(Workq* q, int id, uint flag) {

  // Use astack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   one entry per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  // When using marks, we also added nmark == prog_->size().
  // (Otherwise, nmark == 0.)
  int* stk = astack_;
  int nstk = 0;

  stk[nstk++] = id;
  while (nstk > 0) {
    DCHECK_LE(nstk, nastack_);
    id = stk[--nstk];

  Loop:
    if (id == Mark) {
      q->mark();
      continue;
    }

    if (id == 0)
      continue;

    // If ip is already on the queue, nothing to do.
    // Otherwise add it.  We don't actually keep all the
    // ones that get added, but adding all of them here
    // increases the likelihood of q->contains(id),
    // reducing the amount of duplicated work.
    if (q->contains(id))
      continue;
    q->insert_new(id);

    // Process instruction.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstByteRange:  // just save these on the queue
      case kInstMatch:
        if (ip->last())
          break;
        id = id+1;
        goto Loop;

      case kInstCapture:    // DFA treats captures as no-ops.
      case kInstNop:
        if (!ip->last())
          stk[nstk++] = id+1;

        // If this instruction is the [00-FF]* loop at the beginning of
        // a leftmost-longest unanchored search, separate with a Mark so
        // that future threads (which will start farther to the right in
        // the input string) are lower priority than current threads.
        if (ip->opcode() == kInstNop && q->maxmark() > 0 &&
            id == prog_->start_unanchored() && id != prog_->start())
          stk[nstk++] = Mark;
        id = ip->out();
        goto Loop;

      case kInstAltMatch:
        DCHECK(!ip->last());
        id = id+1;
        goto Loop;

      case kInstEmptyWidth:
        if (!ip->last())
          stk[nstk++] = id+1;

        // Continue on if we have all the right flag bits.
        if (ip->empty() & ~flag)
          break;
        id = ip->out();
        goto Loop;
    }
  }
}